

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

void embree::avx::ConeCurveMiIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  ulong uVar84;
  uint uVar85;
  uint uVar86;
  ulong uVar87;
  ulong uVar88;
  undefined1 (*pauVar89) [16];
  Scene *pSVar90;
  float fVar91;
  undefined1 auVar92 [16];
  float fVar101;
  float fVar102;
  float fVar104;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar105;
  float fVar106;
  undefined1 auVar97 [32];
  float fVar103;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar118;
  float fVar121;
  float fVar125;
  float fVar127;
  float fVar129;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar131;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar169;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar170;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  float fVar181;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar196 [28];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  float fVar199;
  float fVar201;
  undefined1 auVar200 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar216;
  undefined1 auVar217 [32];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar218 [64];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_670 [16];
  Primitive *local_660;
  Scene *local_658;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 (*local_5e0) [16];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 local_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  undefined1 local_490 [16];
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  local_560._0_8_ = context;
  pSVar90 = context->scene;
  uVar86 = line->sharedGeomID;
  uVar85 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar90->geometries).items[uVar86].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar3 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[4];
  uVar5 = (line->v0).field_0.i[5];
  auVar93._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * (long)p_Var12);
  auVar93._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar85 * (long)p_Var12);
  auVar112._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar112._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar3 * (long)p_Var12);
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[3];
  uVar8 = (line->v0).field_0.i[6];
  auVar132._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar132._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  uVar9 = (line->v0).field_0.i[7];
  auVar145._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar9 * (long)p_Var12);
  auVar145._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar182._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * (long)p_Var12);
  auVar182._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar85 + 1) * (long)p_Var12);
  auVar197._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar197._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar3 + 1) * (long)p_Var12);
  auVar174 = vunpcklps_avx(auVar93,auVar132);
  auVar214 = vunpckhps_avx(auVar93,auVar132);
  auVar187 = vunpcklps_avx(auVar112,auVar145);
  auVar166 = vunpckhps_avx(auVar112,auVar145);
  auVar48 = vunpcklps_avx(auVar174,auVar187);
  auVar213 = vunpckhps_avx(auVar174,auVar187);
  auVar49 = vunpcklps_avx(auVar214,auVar166);
  auVar217 = vunpckhps_avx(auVar214,auVar166);
  auVar94._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar94._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar113._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar9 + 1) * (long)p_Var12);
  auVar113._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar174 = vunpcklps_avx(auVar182,auVar94);
  auVar214 = vunpckhps_avx(auVar182,auVar94);
  auVar187 = vunpcklps_avx(auVar197,auVar113);
  auVar166 = vunpckhps_avx(auVar197,auVar113);
  auVar112 = vunpcklps_avx(auVar174,auVar187);
  auVar93 = vunpckhps_avx(auVar174,auVar187);
  auVar113 = vunpcklps_avx(auVar214,auVar166);
  auVar94 = vunpckhps_avx(auVar214,auVar166);
  auVar92 = vpcmpeqd_avx(auVar94._0_16_,auVar94._0_16_);
  auVar111 = vpcmpeqd_avx(auVar92,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar92 = vpcmpeqd_avx(auVar92,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_150 = vshufps_avx(ZEXT416(uVar86),ZEXT416(uVar86),0);
  local_160 = local_150;
  local_5c0 = *(float *)(ray + k * 4 + 0x40);
  local_3e0 = *(float *)(ray + k * 4 + 0x50);
  local_260 = *(float *)(ray + k * 4 + 0x60);
  auVar95._16_16_ = auVar92;
  auVar95._0_16_ = auVar111;
  auVar92 = ZEXT416((uint)(local_5c0 * local_5c0 + local_3e0 * local_3e0 + local_260 * local_260));
  auVar92 = vshufps_avx(auVar92,auVar92,0);
  auVar96._16_16_ = auVar92;
  auVar96._0_16_ = auVar92;
  auVar214 = vrcpps_avx(auVar96);
  fVar107 = auVar214._0_4_;
  fVar118 = auVar214._4_4_;
  auVar166._4_4_ = fVar118 * auVar92._4_4_;
  auVar166._0_4_ = fVar107 * auVar92._0_4_;
  fVar121 = auVar214._8_4_;
  auVar166._8_4_ = fVar121 * auVar92._8_4_;
  fVar123 = auVar214._12_4_;
  auVar166._12_4_ = fVar123 * auVar92._12_4_;
  fVar125 = auVar214._16_4_;
  auVar166._16_4_ = fVar125 * auVar92._0_4_;
  fVar127 = auVar214._20_4_;
  auVar166._20_4_ = fVar127 * auVar92._4_4_;
  fVar129 = auVar214._24_4_;
  auVar166._24_4_ = fVar129 * auVar92._8_4_;
  auVar166._28_4_ = auVar92._12_4_;
  auVar133._8_4_ = 0x3f800000;
  auVar133._0_8_ = 0x3f8000003f800000;
  auVar133._12_4_ = 0x3f800000;
  auVar133._16_4_ = 0x3f800000;
  auVar133._20_4_ = 0x3f800000;
  auVar133._24_4_ = 0x3f800000;
  auVar133._28_4_ = 0x3f800000;
  auVar166 = vsubps_avx(auVar133,auVar166);
  fVar105 = auVar214._28_4_ + auVar166._28_4_;
  auVar187._4_4_ = (auVar48._4_4_ + auVar112._4_4_) * 0.5;
  auVar187._0_4_ = (auVar48._0_4_ + auVar112._0_4_) * 0.5;
  auVar187._8_4_ = (auVar48._8_4_ + auVar112._8_4_) * 0.5;
  auVar187._12_4_ = (auVar48._12_4_ + auVar112._12_4_) * 0.5;
  auVar187._16_4_ = (auVar48._16_4_ + auVar112._16_4_) * 0.5;
  auVar187._20_4_ = (auVar48._20_4_ + auVar112._20_4_) * 0.5;
  auVar187._24_4_ = (auVar48._24_4_ + auVar112._24_4_) * 0.5;
  auVar187._28_4_ = auVar48._28_4_ + auVar112._28_4_;
  fVar131 = auVar213._28_4_;
  auVar214._4_4_ = (auVar93._4_4_ + auVar213._4_4_) * 0.5;
  auVar214._0_4_ = (auVar93._0_4_ + auVar213._0_4_) * 0.5;
  auVar214._8_4_ = (auVar93._8_4_ + auVar213._8_4_) * 0.5;
  auVar214._12_4_ = (auVar93._12_4_ + auVar213._12_4_) * 0.5;
  auVar214._16_4_ = (auVar93._16_4_ + auVar213._16_4_) * 0.5;
  auVar214._20_4_ = (auVar93._20_4_ + auVar213._20_4_) * 0.5;
  auVar214._24_4_ = (auVar93._24_4_ + auVar213._24_4_) * 0.5;
  auVar214._28_4_ = auVar93._28_4_ + fVar131;
  auVar174._4_4_ = (auVar113._4_4_ + auVar49._4_4_) * 0.5;
  auVar174._0_4_ = (auVar113._0_4_ + auVar49._0_4_) * 0.5;
  auVar174._8_4_ = (auVar113._8_4_ + auVar49._8_4_) * 0.5;
  auVar174._12_4_ = (auVar113._12_4_ + auVar49._12_4_) * 0.5;
  auVar174._16_4_ = (auVar113._16_4_ + auVar49._16_4_) * 0.5;
  auVar174._20_4_ = (auVar113._20_4_ + auVar49._20_4_) * 0.5;
  auVar174._24_4_ = (auVar113._24_4_ + auVar49._24_4_) * 0.5;
  auVar174._28_4_ = 0x3f000000;
  fVar199 = *(float *)(ray + k * 4 + 0x10);
  auVar171._4_4_ = fVar199;
  auVar171._0_4_ = fVar199;
  auVar171._8_4_ = fVar199;
  auVar171._12_4_ = fVar199;
  auVar171._16_4_ = fVar199;
  auVar171._20_4_ = fVar199;
  auVar171._24_4_ = fVar199;
  auVar171._28_4_ = fVar199;
  auVar214 = vsubps_avx(auVar214,auVar171);
  fVar201 = *(float *)(ray + k * 4 + 0x20);
  auVar183._4_4_ = fVar201;
  auVar183._0_4_ = fVar201;
  auVar183._8_4_ = fVar201;
  auVar183._12_4_ = fVar201;
  auVar183._16_4_ = fVar201;
  auVar183._20_4_ = fVar201;
  auVar183._24_4_ = fVar201;
  auVar183._28_4_ = fVar201;
  auVar174 = vsubps_avx(auVar174,auVar183);
  fVar170 = *(float *)(ray + k * 4);
  auVar160._4_4_ = fVar170;
  auVar160._0_4_ = fVar170;
  auVar160._8_4_ = fVar170;
  auVar160._12_4_ = fVar170;
  auVar160._16_4_ = fVar170;
  auVar160._20_4_ = fVar170;
  auVar160._24_4_ = fVar170;
  auVar160._28_4_ = fVar170;
  auVar187 = vsubps_avx(auVar187,auVar160);
  fStack_5c4 = auVar187._28_4_ + auVar214._28_4_ + auVar174._28_4_;
  fVar108 = (local_5c0 * auVar187._0_4_ + local_3e0 * auVar214._0_4_ + local_260 * auVar174._0_4_) *
            (fVar107 + fVar107 * auVar166._0_4_);
  fVar119 = (local_5c0 * auVar187._4_4_ + local_3e0 * auVar214._4_4_ + local_260 * auVar174._4_4_) *
            (fVar118 + fVar118 * auVar166._4_4_);
  fStack_5d8 = (local_5c0 * auVar187._8_4_ + local_3e0 * auVar214._8_4_ + local_260 * auVar174._8_4_
               ) * (fVar121 + fVar121 * auVar166._8_4_);
  fStack_5d4 = (local_5c0 * auVar187._12_4_ +
               local_3e0 * auVar214._12_4_ + local_260 * auVar174._12_4_) *
               (fVar123 + fVar123 * auVar166._12_4_);
  fStack_5d0 = (local_5c0 * auVar187._16_4_ +
               local_3e0 * auVar214._16_4_ + local_260 * auVar174._16_4_) *
               (fVar125 + fVar125 * auVar166._16_4_);
  fStack_5cc = (local_5c0 * auVar187._20_4_ +
               local_3e0 * auVar214._20_4_ + local_260 * auVar174._20_4_) *
               (fVar127 + fVar127 * auVar166._20_4_);
  fStack_5c8 = (local_5c0 * auVar187._24_4_ +
               local_3e0 * auVar214._24_4_ + local_260 * auVar174._24_4_) *
               (fVar129 + fVar129 * auVar166._24_4_);
  auVar134._0_4_ = fVar170 + local_5c0 * fVar108;
  auVar134._4_4_ = fVar170 + local_5c0 * fVar119;
  auVar134._8_4_ = fVar170 + local_5c0 * fStack_5d8;
  auVar134._12_4_ = fVar170 + local_5c0 * fStack_5d4;
  auVar134._16_4_ = fVar170 + local_5c0 * fStack_5d0;
  auVar134._20_4_ = fVar170 + local_5c0 * fStack_5cc;
  auVar134._24_4_ = fVar170 + local_5c0 * fStack_5c8;
  auVar134._28_4_ = fVar170 + fVar105;
  auVar225._0_4_ = fVar199 + local_3e0 * fVar108;
  auVar225._4_4_ = fVar199 + local_3e0 * fVar119;
  auVar225._8_4_ = fVar199 + local_3e0 * fStack_5d8;
  auVar225._12_4_ = fVar199 + local_3e0 * fStack_5d4;
  auVar225._16_4_ = fVar199 + local_3e0 * fStack_5d0;
  auVar225._20_4_ = fVar199 + local_3e0 * fStack_5cc;
  auVar225._24_4_ = fVar199 + local_3e0 * fStack_5c8;
  auVar225._28_4_ = fVar199 + fVar105;
  auVar202._0_4_ = fVar201 + local_260 * fVar108;
  auVar202._4_4_ = fVar201 + local_260 * fVar119;
  auVar202._8_4_ = fVar201 + local_260 * fStack_5d8;
  auVar202._12_4_ = fVar201 + local_260 * fStack_5d4;
  auVar202._16_4_ = fVar201 + local_260 * fStack_5d0;
  auVar202._20_4_ = fVar201 + local_260 * fStack_5cc;
  auVar202._24_4_ = fVar201 + local_260 * fStack_5c8;
  auVar202._28_4_ = fVar201 + fVar105;
  local_280 = vsubps_avx(auVar93,auVar213);
  local_2a0 = vsubps_avx(auVar113,auVar49);
  fVar199 = local_2a0._0_4_;
  fVar127 = local_2a0._4_4_;
  fVar18 = local_2a0._8_4_;
  fVar24 = local_2a0._12_4_;
  fVar30 = local_2a0._16_4_;
  fVar36 = local_2a0._20_4_;
  fVar42 = local_2a0._24_4_;
  fVar201 = local_280._0_4_;
  fVar129 = local_280._4_4_;
  fVar19 = local_280._8_4_;
  fVar25 = local_280._12_4_;
  fVar31 = local_280._16_4_;
  fVar37 = local_280._20_4_;
  fVar43 = local_280._24_4_;
  local_620 = vsubps_avx(auVar112,auVar48);
  fVar107 = local_620._0_4_;
  fVar13 = local_620._4_4_;
  fVar20 = local_620._8_4_;
  fVar26 = local_620._12_4_;
  fVar32 = local_620._16_4_;
  fVar38 = local_620._20_4_;
  fVar44 = local_620._24_4_;
  local_2e0._0_4_ = fVar107 * fVar107 + fVar201 * fVar201 + fVar199 * fVar199;
  local_2e0._4_4_ = fVar13 * fVar13 + fVar129 * fVar129 + fVar127 * fVar127;
  fStack_2d8 = fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18;
  fStack_2d4 = fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24;
  fStack_2d0 = fVar32 * fVar32 + fVar31 * fVar31 + fVar30 * fVar30;
  fStack_2cc = fVar38 * fVar38 + fVar37 * fVar37 + fVar36 * fVar36;
  fStack_2c8 = fVar44 * fVar44 + fVar43 * fVar43 + fVar42 * fVar42;
  local_400 = vsubps_avx(auVar225,auVar213);
  local_2c0 = vsubps_avx(auVar202,auVar49);
  fVar118 = local_2c0._0_4_;
  fVar14 = local_2c0._4_4_;
  fVar21 = local_2c0._8_4_;
  fVar27 = local_2c0._12_4_;
  fVar33 = local_2c0._16_4_;
  fVar39 = local_2c0._20_4_;
  fVar45 = local_2c0._24_4_;
  fVar121 = local_400._0_4_;
  fVar15 = local_400._4_4_;
  fVar22 = local_400._8_4_;
  fVar28 = local_400._12_4_;
  fVar34 = local_400._16_4_;
  fVar40 = local_400._20_4_;
  fVar46 = local_400._24_4_;
  fVar139 = auVar49._28_4_;
  fVar106 = fVar139 + fVar170 + fVar105;
  _local_180 = vsubps_avx(auVar134,auVar48);
  fVar123 = local_180._0_4_;
  fVar16 = local_180._4_4_;
  fVar23 = local_180._8_4_;
  fVar29 = local_180._12_4_;
  fVar35 = local_180._16_4_;
  fVar41 = local_180._20_4_;
  fVar47 = local_180._24_4_;
  fVar205 = fVar107 * fVar123 + fVar201 * fVar121 + fVar199 * fVar118;
  fVar206 = fVar13 * fVar16 + fVar129 * fVar15 + fVar127 * fVar14;
  fVar207 = fVar20 * fVar23 + fVar19 * fVar22 + fVar18 * fVar21;
  fVar208 = fVar26 * fVar29 + fVar25 * fVar28 + fVar24 * fVar27;
  fVar209 = fVar32 * fVar35 + fVar31 * fVar34 + fVar30 * fVar33;
  fVar210 = fVar38 * fVar41 + fVar37 * fVar40 + fVar36 * fVar39;
  fVar211 = fVar44 * fVar47 + fVar43 * fVar46 + fVar42 * fVar45;
  fVar212 = fVar131 + fVar106;
  fVar106 = fVar131 + fVar106;
  auVar203._0_4_ = local_5c0 * fVar107 + local_3e0 * fVar201 + fVar199 * local_260;
  auVar203._4_4_ = local_5c0 * fVar13 + local_3e0 * fVar129 + fVar127 * local_260;
  auVar203._8_4_ = local_5c0 * fVar20 + local_3e0 * fVar19 + fVar18 * local_260;
  auVar203._12_4_ = local_5c0 * fVar26 + local_3e0 * fVar25 + fVar24 * local_260;
  auVar203._16_4_ = local_5c0 * fVar32 + local_3e0 * fVar31 + fVar30 * local_260;
  auVar203._20_4_ = local_5c0 * fVar38 + local_3e0 * fVar37 + fVar36 * local_260;
  auVar203._24_4_ = local_5c0 * fVar44 + local_3e0 * fVar43 + fVar42 * local_260;
  auVar203._28_4_ = fVar131 + fVar106;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  auVar96 = local_400;
  auVar132 = _local_180;
  auVar214 = vsubps_avx(auVar217,auVar94);
  fVar125 = auVar214._0_4_;
  fVar17 = auVar214._4_4_;
  fVar91 = auVar214._8_4_;
  fVar101 = auVar214._12_4_;
  fVar102 = auVar214._16_4_;
  fVar103 = auVar214._20_4_;
  fVar104 = auVar214._24_4_;
  fVar109 = (float)local_2e0._0_4_ + fVar125 * fVar125;
  fVar120 = (float)local_2e0._4_4_ + fVar17 * fVar17;
  fVar122 = fStack_2d8 + fVar91 * fVar91;
  fVar124 = fStack_2d4 + fVar101 * fVar101;
  fVar126 = fStack_2d0 + fVar102 * fVar102;
  fVar128 = fStack_2cc + fVar103 * fVar103;
  fVar130 = fStack_2c8 + fVar104 * fVar104;
  fVar150 = (float)local_2e0._0_4_ * (float)local_2e0._0_4_;
  fVar154 = (float)local_2e0._4_4_ * (float)local_2e0._4_4_;
  local_120._4_4_ = fVar154;
  local_120._0_4_ = fVar150;
  fVar155 = fStack_2d8 * fStack_2d8;
  fStack_118 = fVar155;
  fVar156 = fStack_2d4 * fStack_2d4;
  fStack_114 = fVar156;
  fVar157 = fStack_2d0 * fStack_2d0;
  fStack_110 = fVar157;
  fVar158 = fStack_2cc * fStack_2cc;
  fStack_10c = fVar158;
  fVar159 = fStack_2c8 * fStack_2c8;
  fStack_108 = fVar159;
  uStack_104 = fVar139 + fVar131;
  auVar213._4_4_ = fVar154 * (local_5c0 * fVar16 + local_3e0 * fVar15 + local_260 * fVar14);
  auVar213._0_4_ = fVar150 * (local_5c0 * fVar123 + local_3e0 * fVar121 + local_260 * fVar118);
  auVar213._8_4_ = fVar155 * (local_5c0 * fVar23 + local_3e0 * fVar22 + local_260 * fVar21);
  auVar213._12_4_ = fVar156 * (local_5c0 * fVar29 + local_3e0 * fVar28 + local_260 * fVar27);
  auVar213._16_4_ = fVar157 * (local_5c0 * fVar35 + local_3e0 * fVar34 + local_260 * fVar33);
  auVar213._20_4_ = fVar158 * (local_5c0 * fVar41 + local_3e0 * fVar40 + local_260 * fVar39);
  auVar213._24_4_ = fVar159 * (local_5c0 * fVar47 + local_3e0 * fVar46 + local_260 * fVar45);
  auVar213._28_4_ = fVar131 + fVar131 + fVar106;
  fVar50 = local_2a0._28_4_;
  auVar48._4_4_ = auVar203._4_4_ * fVar206 * fVar120;
  auVar48._0_4_ = auVar203._0_4_ * fVar205 * fVar109;
  auVar48._8_4_ = auVar203._8_4_ * fVar207 * fVar122;
  auVar48._12_4_ = auVar203._12_4_ * fVar208 * fVar124;
  auVar48._16_4_ = auVar203._16_4_ * fVar209 * fVar126;
  auVar48._20_4_ = auVar203._20_4_ * fVar210 * fVar128;
  auVar48._24_4_ = auVar203._24_4_ * fVar211 * fVar130;
  auVar48._28_4_ = fVar50;
  auVar166 = vsubps_avx(auVar213,auVar48);
  fStack_2c4 = fVar170 + fVar170 + fVar105;
  fVar170 = auVar217._0_4_;
  fVar181 = (float)local_2e0._0_4_ * fVar170;
  fVar105 = auVar217._4_4_;
  fVar190 = (float)local_2e0._4_4_ * fVar105;
  auVar49._4_4_ = fVar190;
  auVar49._0_4_ = fVar181;
  fVar106 = auVar217._8_4_;
  fVar191 = fStack_2d8 * fVar106;
  auVar49._8_4_ = fVar191;
  fVar177 = auVar217._12_4_;
  fVar192 = fStack_2d4 * fVar177;
  auVar49._12_4_ = fVar192;
  fVar178 = auVar217._16_4_;
  fVar193 = fStack_2d0 * fVar178;
  auVar49._16_4_ = fVar193;
  fVar179 = auVar217._20_4_;
  fVar194 = fStack_2cc * fVar179;
  auVar49._20_4_ = fVar194;
  fVar180 = auVar217._24_4_;
  fVar195 = fStack_2c8 * fVar180;
  auVar49._24_4_ = fVar195;
  auVar49._28_4_ = fVar50;
  auVar97._0_4_ = fVar181 * auVar203._0_4_ * fVar125 + auVar166._0_4_;
  auVar97._4_4_ = fVar190 * auVar203._4_4_ * fVar17 + auVar166._4_4_;
  auVar97._8_4_ = fVar191 * auVar203._8_4_ * fVar91 + auVar166._8_4_;
  auVar97._12_4_ = fVar192 * auVar203._12_4_ * fVar101 + auVar166._12_4_;
  auVar97._16_4_ = fVar193 * auVar203._16_4_ * fVar102 + auVar166._16_4_;
  auVar97._20_4_ = fVar194 * auVar203._20_4_ * fVar103 + auVar166._20_4_;
  auVar97._24_4_ = fVar195 * auVar203._24_4_ * fVar104 + auVar166._24_4_;
  auVar97._28_4_ = local_5c0 + auVar166._28_4_;
  auVar217._4_4_ = fVar154 * (fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14);
  auVar217._0_4_ = fVar150 * (fVar123 * fVar123 + fVar121 * fVar121 + fVar118 * fVar118);
  auVar217._8_4_ = fVar155 * (fVar23 * fVar23 + fVar22 * fVar22 + fVar21 * fVar21);
  auVar217._12_4_ = fVar156 * (fVar29 * fVar29 + fVar28 * fVar28 + fVar27 * fVar27);
  auVar217._16_4_ = fVar157 * (fVar35 * fVar35 + fVar34 * fVar34 + fVar33 * fVar33);
  auVar217._20_4_ = fVar158 * (fVar41 * fVar41 + fVar40 * fVar40 + fVar39 * fVar39);
  auVar217._24_4_ = fVar159 * (fVar47 * fVar47 + fVar46 * fVar46 + fVar45 * fVar45);
  auVar217._28_4_ = fVar139 + fVar139 + fVar131;
  auVar51._4_4_ = fVar206 * fVar206 * fVar120;
  auVar51._0_4_ = fVar205 * fVar205 * fVar109;
  auVar51._8_4_ = fVar207 * fVar207 * fVar122;
  auVar51._12_4_ = fVar208 * fVar208 * fVar124;
  auVar51._16_4_ = fVar209 * fVar209 * fVar126;
  auVar51._20_4_ = fVar210 * fVar210 * fVar128;
  auVar51._24_4_ = fVar211 * fVar211 * fVar130;
  auVar51._28_4_ = local_5c0;
  auVar166 = vsubps_avx(auVar217,auVar51);
  auVar52._4_4_ = (fVar17 + fVar17) * fVar206;
  auVar52._0_4_ = (fVar125 + fVar125) * fVar205;
  auVar52._8_4_ = (fVar91 + fVar91) * fVar207;
  auVar52._12_4_ = (fVar101 + fVar101) * fVar208;
  auVar52._16_4_ = (fVar102 + fVar102) * fVar209;
  auVar52._20_4_ = (fVar103 + fVar103) * fVar210;
  auVar52._24_4_ = (fVar104 + fVar104) * fVar211;
  auVar52._28_4_ = auVar214._28_4_ + auVar214._28_4_;
  auVar214 = vsubps_avx(auVar52,auVar49);
  fVar131 = auVar203._0_4_ * auVar203._0_4_;
  fVar139 = auVar203._4_4_ * auVar203._4_4_;
  fVar140 = auVar203._8_4_ * auVar203._8_4_;
  fVar141 = auVar203._12_4_ * auVar203._12_4_;
  fVar142 = auVar203._16_4_ * auVar203._16_4_;
  fVar143 = auVar203._20_4_ * auVar203._20_4_;
  fVar144 = auVar203._24_4_ * auVar203._24_4_;
  auVar53._4_4_ = fVar120 * fVar139;
  auVar53._0_4_ = fVar109 * fVar131;
  auVar53._8_4_ = fVar122 * fVar140;
  auVar53._12_4_ = fVar124 * fVar141;
  auVar53._16_4_ = fVar126 * fVar142;
  auVar53._20_4_ = fVar128 * fVar143;
  auVar53._24_4_ = fVar130 * fVar144;
  auVar53._28_4_ = fVar50;
  auVar174 = vsubps_avx(_local_120,auVar53);
  auVar54._4_4_ = auVar174._4_4_ * (fVar190 * auVar214._4_4_ + auVar166._4_4_);
  auVar54._0_4_ = auVar174._0_4_ * (fVar181 * auVar214._0_4_ + auVar166._0_4_);
  auVar54._8_4_ = auVar174._8_4_ * (fVar191 * auVar214._8_4_ + auVar166._8_4_);
  auVar54._12_4_ = auVar174._12_4_ * (fVar192 * auVar214._12_4_ + auVar166._12_4_);
  auVar54._16_4_ = auVar174._16_4_ * (fVar193 * auVar214._16_4_ + auVar166._16_4_);
  auVar54._20_4_ = auVar174._20_4_ * (fVar194 * auVar214._20_4_ + auVar166._20_4_);
  auVar54._24_4_ = auVar174._24_4_ * (fVar195 * auVar214._24_4_ + auVar166._24_4_);
  auVar54._28_4_ = fVar50 + auVar166._28_4_;
  auVar55._4_4_ = auVar97._4_4_ * auVar97._4_4_;
  auVar55._0_4_ = auVar97._0_4_ * auVar97._0_4_;
  auVar55._8_4_ = auVar97._8_4_ * auVar97._8_4_;
  auVar55._12_4_ = auVar97._12_4_ * auVar97._12_4_;
  auVar55._16_4_ = auVar97._16_4_ * auVar97._16_4_;
  auVar55._20_4_ = auVar97._20_4_ * auVar97._20_4_;
  auVar55._24_4_ = auVar97._24_4_ * auVar97._24_4_;
  auVar55._28_4_ = auVar214._28_4_;
  auVar166 = vsubps_avx(auVar55,auVar54);
  uVar87 = (ulong)((line->leftExists & 0xf) << 4);
  uVar88 = (ulong)(line->leftExists & 0xfffffff0);
  auVar213 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar214 = vcmpps_avx(auVar166,auVar213,5);
  auVar187 = auVar214 & ~auVar95;
  if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar187 >> 0x7f,0) != '\0') ||
        (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar187 >> 0xbf,0) != '\0') ||
      (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar187[0x1f] < '\0')
  {
    auVar187 = vandnps_avx(auVar95,auVar214);
    auVar48 = vsubps_avx(auVar134,auVar112);
    auVar49 = vsubps_avx(auVar225,auVar93);
    auVar112 = vsubps_avx(auVar202,auVar113);
    fVar216 = auVar48._0_4_ * fVar107 + auVar49._0_4_ * fVar201 + auVar112._0_4_ * fVar199;
    fVar219 = auVar48._4_4_ * fVar13 + auVar49._4_4_ * fVar129 + auVar112._4_4_ * fVar127;
    fVar220 = auVar48._8_4_ * fVar20 + auVar49._8_4_ * fVar19 + auVar112._8_4_ * fVar18;
    fVar221 = auVar48._12_4_ * fVar26 + auVar49._12_4_ * fVar25 + auVar112._12_4_ * fVar24;
    fVar222 = auVar48._16_4_ * fVar32 + auVar49._16_4_ * fVar31 + auVar112._16_4_ * fVar30;
    fVar223 = auVar48._20_4_ * fVar38 + auVar49._20_4_ * fVar37 + auVar112._20_4_ * fVar36;
    fVar224 = auVar48._24_4_ * fVar44 + auVar49._24_4_ * fVar43 + auVar112._24_4_ * fVar42;
    auVar166 = vsqrtps_avx(auVar166);
    auVar217 = vrcpps_avx(auVar174);
    fStack_1f4 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + uVar88 + 8) >> 0x20);
    fVar181 = auVar217._0_4_;
    auVar164._0_4_ = auVar174._0_4_ * fVar181;
    fVar190 = auVar217._4_4_;
    auVar164._4_4_ = auVar174._4_4_ * fVar190;
    fVar191 = auVar217._8_4_;
    auVar164._8_4_ = auVar174._8_4_ * fVar191;
    fVar192 = auVar217._12_4_;
    auVar164._12_4_ = auVar174._12_4_ * fVar192;
    fVar193 = auVar217._16_4_;
    auVar164._16_4_ = auVar174._16_4_ * fVar193;
    fVar194 = auVar217._20_4_;
    auVar164._20_4_ = auVar174._20_4_ * fVar194;
    fVar195 = auVar217._24_4_;
    auVar164._24_4_ = auVar174._24_4_ * fVar195;
    auVar164._28_4_ = 0;
    fStack_214 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + uVar87 + 8) >> 0x20);
    auVar161._8_4_ = 0x3f800000;
    auVar161._0_8_ = 0x3f8000003f800000;
    auVar161._12_4_ = 0x3f800000;
    auVar161._16_4_ = 0x3f800000;
    auVar161._20_4_ = 0x3f800000;
    auVar161._24_4_ = 0x3f800000;
    auVar161._28_4_ = 0x3f800000;
    auVar93 = vsubps_avx(auVar161,auVar164);
    auVar172._8_4_ = 0x7fffffff;
    auVar172._0_8_ = 0x7fffffff7fffffff;
    auVar172._12_4_ = 0x7fffffff;
    auVar172._16_4_ = 0x7fffffff;
    auVar172._20_4_ = 0x7fffffff;
    auVar172._24_4_ = 0x7fffffff;
    auVar172._28_4_ = 0x7fffffff;
    fVar181 = fVar181 + fVar181 * auVar93._0_4_;
    fVar190 = fVar190 + fVar190 * auVar93._4_4_;
    fVar191 = fVar191 + fVar191 * auVar93._8_4_;
    fVar192 = fVar192 + fVar192 * auVar93._12_4_;
    fVar193 = fVar193 + fVar193 * auVar93._16_4_;
    fVar194 = fVar194 + fVar194 * auVar93._20_4_;
    fVar195 = fVar195 + fVar195 * auVar93._24_4_;
    auVar214 = vandps_avx(auVar174,auVar172);
    auVar184._8_4_ = 0x219392ef;
    auVar184._0_8_ = 0x219392ef219392ef;
    auVar184._12_4_ = 0x219392ef;
    auVar184._16_4_ = 0x219392ef;
    auVar184._20_4_ = 0x219392ef;
    auVar184._24_4_ = 0x219392ef;
    auVar184._28_4_ = 0x219392ef;
    auVar214 = vcmpps_avx(auVar214,auVar184,2);
    uVar84 = CONCAT44(auVar97._4_4_,auVar97._0_4_);
    auVar185._0_8_ = uVar84 ^ 0x8000000080000000;
    auVar185._8_4_ = -auVar97._8_4_;
    auVar185._12_4_ = -auVar97._12_4_;
    auVar185._16_4_ = -auVar97._16_4_;
    auVar185._20_4_ = -auVar97._20_4_;
    auVar185._24_4_ = -auVar97._24_4_;
    auVar185._28_4_ = -auVar97._28_4_;
    auVar174 = vsubps_avx(auVar185,auVar166);
    auVar113 = vsubps_avx(auVar166,auVar97);
    auVar56._4_4_ = auVar174._4_4_ * fVar190;
    auVar56._0_4_ = auVar174._0_4_ * fVar181;
    auVar56._8_4_ = auVar174._8_4_ * fVar191;
    auVar56._12_4_ = auVar174._12_4_ * fVar192;
    auVar56._16_4_ = auVar174._16_4_ * fVar193;
    auVar56._20_4_ = auVar174._20_4_ * fVar194;
    auVar56._24_4_ = auVar174._24_4_ * fVar195;
    auVar56._28_4_ = auVar166._28_4_;
    auVar57._4_4_ = auVar113._4_4_ * fVar190;
    auVar57._0_4_ = auVar113._0_4_ * fVar181;
    auVar57._8_4_ = auVar113._8_4_ * fVar191;
    auVar57._12_4_ = auVar113._12_4_ * fVar192;
    auVar57._16_4_ = auVar113._16_4_ * fVar193;
    auVar57._20_4_ = auVar113._20_4_ * fVar194;
    auVar57._24_4_ = auVar113._24_4_ * fVar195;
    auVar57._28_4_ = auVar113._28_4_;
    auVar114._8_4_ = 0xff800000;
    auVar114._0_8_ = 0xff800000ff800000;
    auVar114._12_4_ = 0xff800000;
    auVar114._16_4_ = 0xff800000;
    auVar114._20_4_ = 0xff800000;
    auVar114._24_4_ = 0xff800000;
    auVar114._28_4_ = 0xff800000;
    auVar166 = vblendvps_avx(auVar56,auVar114,auVar214);
    auVar151._8_4_ = 0x7f800000;
    auVar151._0_8_ = 0x7f8000007f800000;
    auVar151._12_4_ = 0x7f800000;
    auVar151._16_4_ = 0x7f800000;
    auVar151._20_4_ = 0x7f800000;
    auVar151._24_4_ = 0x7f800000;
    auVar151._28_4_ = 0x7f800000;
    auVar174 = vblendvps_avx(auVar57,auVar151,auVar214);
    auVar173._0_4_ = fVar205 + auVar203._0_4_ * auVar166._0_4_;
    auVar173._4_4_ = fVar206 + auVar203._4_4_ * auVar166._4_4_;
    auVar173._8_4_ = fVar207 + auVar203._8_4_ * auVar166._8_4_;
    auVar173._12_4_ = fVar208 + auVar203._12_4_ * auVar166._12_4_;
    auVar173._16_4_ = fVar209 + auVar203._16_4_ * auVar166._16_4_;
    auVar173._20_4_ = fVar210 + auVar203._20_4_ * auVar166._20_4_;
    auVar173._24_4_ = fVar211 + auVar203._24_4_ * auVar166._24_4_;
    auVar173._28_4_ = fVar212 + auVar217._28_4_ + auVar93._28_4_;
    auVar214 = vcmpps_avx(auVar173,auVar213,6);
    auVar213 = vcmpps_avx(auVar173,_local_2e0,1);
    auVar214 = vandps_avx(auVar213,auVar214);
    auVar214 = vandps_avx(auVar187,auVar214);
    local_300 = vblendvps_avx(auVar151,auVar166,auVar214);
    local_460._0_4_ = fVar205 + auVar203._0_4_ * auVar174._0_4_;
    local_460._4_4_ = fVar206 + auVar203._4_4_ * auVar174._4_4_;
    fStack_458 = fVar207 + auVar203._8_4_ * auVar174._8_4_;
    fStack_454 = fVar208 + auVar203._12_4_ * auVar174._12_4_;
    fStack_450 = fVar209 + auVar203._16_4_ * auVar174._16_4_;
    fStack_44c = fVar210 + auVar203._20_4_ * auVar174._20_4_;
    fStack_448 = fVar211 + auVar203._24_4_ * auVar174._24_4_;
    register0x000015dc = fVar212 + local_300._28_4_;
    auVar214 = vcmpps_avx(_local_460,ZEXT1232(ZEXT412(0)) << 0x20,6);
    auVar166 = vcmpps_avx(_local_460,_local_2e0,1);
    auVar214 = vandps_avx(auVar166,auVar214);
    auVar214 = vandps_avx(auVar187,auVar214);
    local_520 = vblendvps_avx(auVar114,auVar174,auVar214);
    auVar93 = vrcpps_avx(auVar203);
    fVar181 = auVar93._0_4_;
    fVar190 = auVar93._4_4_;
    auVar58._4_4_ = auVar203._4_4_ * fVar190;
    auVar58._0_4_ = auVar203._0_4_ * fVar181;
    fVar191 = auVar93._8_4_;
    auVar58._8_4_ = auVar203._8_4_ * fVar191;
    fVar192 = auVar93._12_4_;
    auVar58._12_4_ = auVar203._12_4_ * fVar192;
    fVar193 = auVar93._16_4_;
    auVar58._16_4_ = auVar203._16_4_ * fVar193;
    fVar194 = auVar93._20_4_;
    auVar58._20_4_ = auVar203._20_4_ * fVar194;
    fVar195 = auVar93._24_4_;
    auVar58._24_4_ = auVar203._24_4_ * fVar195;
    auVar58._28_4_ = auVar214._28_4_;
    auVar113 = vsubps_avx(auVar161,auVar58);
    fVar181 = fVar181 + fVar181 * auVar113._0_4_;
    fVar190 = fVar190 + fVar190 * auVar113._4_4_;
    fVar191 = fVar191 + fVar191 * auVar113._8_4_;
    fVar192 = fVar192 + fVar192 * auVar113._12_4_;
    fVar193 = fVar193 + fVar193 * auVar113._16_4_;
    fVar194 = fVar194 + fVar194 * auVar113._20_4_;
    fVar195 = fVar195 + fVar195 * auVar113._24_4_;
    auVar59._4_4_ = auVar203._4_4_ * fVar16;
    auVar59._0_4_ = auVar203._0_4_ * fVar123;
    auVar59._8_4_ = auVar203._8_4_ * fVar23;
    auVar59._12_4_ = auVar203._12_4_ * fVar29;
    auVar59._16_4_ = auVar203._16_4_ * fVar35;
    auVar59._20_4_ = auVar203._20_4_ * fVar41;
    auVar59._24_4_ = auVar203._24_4_ * fVar47;
    auVar59._28_4_ = auVar113._28_4_;
    auVar60._4_4_ = local_5c0 * fVar206;
    auVar60._0_4_ = local_5c0 * fVar205;
    auVar60._8_4_ = local_5c0 * fVar207;
    auVar60._12_4_ = local_5c0 * fVar208;
    auVar60._16_4_ = local_5c0 * fVar209;
    auVar60._20_4_ = local_5c0 * fVar210;
    auVar60._24_4_ = local_5c0 * fVar211;
    auVar60._28_4_ = auVar166._28_4_;
    auVar214 = vsubps_avx(auVar59,auVar60);
    auVar61._4_4_ = auVar203._4_4_ * fVar15;
    auVar61._0_4_ = auVar203._0_4_ * fVar121;
    auVar61._8_4_ = auVar203._8_4_ * fVar22;
    auVar61._12_4_ = auVar203._12_4_ * fVar28;
    auVar61._16_4_ = auVar203._16_4_ * fVar34;
    auVar61._20_4_ = auVar203._20_4_ * fVar40;
    auVar61._24_4_ = auVar203._24_4_ * fVar46;
    auVar61._28_4_ = auVar166._28_4_;
    auVar62._4_4_ = fVar206 * local_3e0;
    auVar62._0_4_ = fVar205 * local_3e0;
    auVar62._8_4_ = fVar207 * local_3e0;
    auVar62._12_4_ = fVar208 * local_3e0;
    auVar62._16_4_ = fVar209 * local_3e0;
    auVar62._20_4_ = fVar210 * local_3e0;
    auVar62._24_4_ = fVar211 * local_3e0;
    auVar62._28_4_ = auVar213._28_4_;
    auVar166 = vsubps_avx(auVar61,auVar62);
    auVar63._4_4_ = auVar203._4_4_ * fVar14;
    auVar63._0_4_ = auVar203._0_4_ * fVar118;
    auVar63._8_4_ = auVar203._8_4_ * fVar21;
    auVar63._12_4_ = auVar203._12_4_ * fVar27;
    auVar63._16_4_ = auVar203._16_4_ * fVar33;
    auVar63._20_4_ = auVar203._20_4_ * fVar39;
    auVar63._24_4_ = auVar203._24_4_ * fVar45;
    auVar63._28_4_ = auVar213._28_4_;
    auVar64._4_4_ = local_260 * fVar206;
    auVar64._0_4_ = local_260 * fVar205;
    auVar64._8_4_ = local_260 * fVar207;
    auVar64._12_4_ = local_260 * fVar208;
    auVar64._16_4_ = local_260 * fVar209;
    auVar64._20_4_ = local_260 * fVar210;
    auVar64._24_4_ = local_260 * fVar211;
    auVar64._28_4_ = auVar217._28_4_;
    auVar174 = vsubps_avx(auVar63,auVar64);
    fVar65 = auVar174._28_4_;
    fVar169 = auVar166._28_4_ + fVar65;
    auVar135._0_4_ =
         auVar214._0_4_ * auVar214._0_4_ +
         auVar166._0_4_ * auVar166._0_4_ + auVar174._0_4_ * auVar174._0_4_;
    auVar135._4_4_ =
         auVar214._4_4_ * auVar214._4_4_ +
         auVar166._4_4_ * auVar166._4_4_ + auVar174._4_4_ * auVar174._4_4_;
    auVar135._8_4_ =
         auVar214._8_4_ * auVar214._8_4_ +
         auVar166._8_4_ * auVar166._8_4_ + auVar174._8_4_ * auVar174._8_4_;
    auVar135._12_4_ =
         auVar214._12_4_ * auVar214._12_4_ +
         auVar166._12_4_ * auVar166._12_4_ + auVar174._12_4_ * auVar174._12_4_;
    auVar135._16_4_ =
         auVar214._16_4_ * auVar214._16_4_ +
         auVar166._16_4_ * auVar166._16_4_ + auVar174._16_4_ * auVar174._16_4_;
    auVar135._20_4_ =
         auVar214._20_4_ * auVar214._20_4_ +
         auVar166._20_4_ * auVar166._20_4_ + auVar174._20_4_ * auVar174._20_4_;
    auVar135._24_4_ =
         auVar214._24_4_ * auVar214._24_4_ +
         auVar166._24_4_ * auVar166._24_4_ + auVar174._24_4_ * auVar174._24_4_;
    auVar135._28_4_ = auVar214._28_4_ + fVar169;
    auVar66._4_4_ = fVar139 * fVar105 * fVar105;
    auVar66._0_4_ = fVar131 * fVar170 * fVar170;
    auVar66._8_4_ = fVar140 * fVar106 * fVar106;
    auVar66._12_4_ = fVar141 * fVar177 * fVar177;
    auVar66._16_4_ = fVar142 * fVar178 * fVar178;
    auVar66._20_4_ = fVar143 * fVar179 * fVar179;
    auVar66._24_4_ = fVar144 * fVar180 * fVar180;
    auVar66._28_4_ = fVar169;
    auVar214 = vcmpps_avx(auVar135,auVar66,1);
    auVar67._4_4_ = fVar190 * -fVar206;
    auVar67._0_4_ = fVar181 * -fVar205;
    auVar67._8_4_ = fVar191 * -fVar207;
    auVar67._12_4_ = fVar192 * -fVar208;
    auVar67._16_4_ = fVar193 * -fVar209;
    auVar67._20_4_ = fVar194 * -fVar210;
    auVar67._24_4_ = fVar195 * -fVar211;
    auVar67._28_4_ = -fVar212;
    auVar166 = vblendvps_avx(auVar151,auVar67,auVar214);
    auVar165._12_4_ = fStack_214;
    auVar165._0_12_ = *(undefined1 (*) [12])(mm_lookupmask_ps + uVar87);
    auVar165._28_4_ = fStack_1f4;
    auVar165._16_12_ = *(undefined1 (*) [12])(mm_lookupmask_ps + uVar88);
    auVar214 = vandnps_avx(auVar165,auVar187);
    auVar174 = vblendvps_avx(auVar151,auVar166,auVar214);
    auVar136._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar136._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar146._0_4_ = auVar203._0_4_ * auVar48._0_4_;
    auVar146._4_4_ = auVar203._4_4_ * auVar48._4_4_;
    auVar146._8_4_ = auVar203._8_4_ * auVar48._8_4_;
    auVar146._12_4_ = auVar203._12_4_ * auVar48._12_4_;
    auVar146._16_4_ = auVar203._16_4_ * auVar48._16_4_;
    auVar146._20_4_ = auVar203._20_4_ * auVar48._20_4_;
    auVar146._24_4_ = auVar203._24_4_ * auVar48._24_4_;
    auVar146._28_4_ = 0;
    auVar68._4_4_ = auVar203._4_4_ * auVar49._4_4_;
    auVar68._0_4_ = auVar203._0_4_ * auVar49._0_4_;
    auVar68._8_4_ = auVar203._8_4_ * auVar49._8_4_;
    auVar68._12_4_ = auVar203._12_4_ * auVar49._12_4_;
    auVar68._16_4_ = auVar203._16_4_ * auVar49._16_4_;
    auVar68._20_4_ = auVar203._20_4_ * auVar49._20_4_;
    auVar68._24_4_ = auVar203._24_4_ * auVar49._24_4_;
    auVar68._28_4_ = auVar214._28_4_;
    auVar69._4_4_ = auVar203._4_4_ * auVar112._4_4_;
    auVar69._0_4_ = auVar203._0_4_ * auVar112._0_4_;
    auVar69._8_4_ = auVar203._8_4_ * auVar112._8_4_;
    auVar69._12_4_ = auVar203._12_4_ * auVar112._12_4_;
    auVar69._16_4_ = auVar203._16_4_ * auVar112._16_4_;
    auVar69._20_4_ = auVar203._20_4_ * auVar112._20_4_;
    auVar69._24_4_ = auVar203._24_4_ * auVar112._24_4_;
    auVar69._28_4_ = 0;
    auVar70._4_4_ = local_5c0 * fVar219;
    auVar70._0_4_ = local_5c0 * fVar216;
    auVar70._8_4_ = local_5c0 * fVar220;
    auVar70._12_4_ = local_5c0 * fVar221;
    auVar70._16_4_ = local_5c0 * fVar222;
    auVar70._20_4_ = local_5c0 * fVar223;
    auVar70._24_4_ = local_5c0 * fVar224;
    auVar70._28_4_ = fVar65;
    auVar214 = vsubps_avx(auVar146,auVar70);
    auVar71._4_4_ = fVar219 * local_3e0;
    auVar71._0_4_ = fVar216 * local_3e0;
    auVar71._8_4_ = fVar220 * local_3e0;
    auVar71._12_4_ = fVar221 * local_3e0;
    auVar71._16_4_ = fVar222 * local_3e0;
    auVar71._20_4_ = fVar223 * local_3e0;
    auVar71._24_4_ = fVar224 * local_3e0;
    auVar71._28_4_ = fVar65;
    auVar166 = vsubps_avx(auVar68,auVar71);
    auVar72._4_4_ = local_260 * fVar219;
    auVar72._0_4_ = local_260 * fVar216;
    auVar72._8_4_ = local_260 * fVar220;
    auVar72._12_4_ = local_260 * fVar221;
    auVar72._16_4_ = local_260 * fVar222;
    auVar72._20_4_ = local_260 * fVar223;
    auVar72._24_4_ = local_260 * fVar224;
    auVar72._28_4_ = fVar65;
    auVar213 = vsubps_avx(auVar69,auVar72);
    auVar115._0_4_ =
         auVar214._0_4_ * auVar214._0_4_ +
         auVar166._0_4_ * auVar166._0_4_ + auVar213._0_4_ * auVar213._0_4_;
    auVar115._4_4_ =
         auVar214._4_4_ * auVar214._4_4_ +
         auVar166._4_4_ * auVar166._4_4_ + auVar213._4_4_ * auVar213._4_4_;
    auVar115._8_4_ =
         auVar214._8_4_ * auVar214._8_4_ +
         auVar166._8_4_ * auVar166._8_4_ + auVar213._8_4_ * auVar213._8_4_;
    auVar115._12_4_ =
         auVar214._12_4_ * auVar214._12_4_ +
         auVar166._12_4_ * auVar166._12_4_ + auVar213._12_4_ * auVar213._12_4_;
    auVar115._16_4_ =
         auVar214._16_4_ * auVar214._16_4_ +
         auVar166._16_4_ * auVar166._16_4_ + auVar213._16_4_ * auVar213._16_4_;
    auVar115._20_4_ =
         auVar214._20_4_ * auVar214._20_4_ +
         auVar166._20_4_ * auVar166._20_4_ + auVar213._20_4_ * auVar213._20_4_;
    auVar115._24_4_ =
         auVar214._24_4_ * auVar214._24_4_ +
         auVar166._24_4_ * auVar166._24_4_ + auVar213._24_4_ * auVar213._24_4_;
    auVar115._28_4_ = auVar214._28_4_ + auVar166._28_4_ + auVar213._28_4_;
    local_580._0_4_ = auVar94._0_4_;
    local_580._4_4_ = auVar94._4_4_;
    fStack_578 = auVar94._8_4_;
    fStack_574 = auVar94._12_4_;
    fStack_570 = auVar94._16_4_;
    fStack_56c = auVar94._20_4_;
    fStack_568 = auVar94._24_4_;
    uStack_564 = auVar94._28_4_;
    auVar73._4_4_ = fVar139 * (float)local_580._4_4_ * (float)local_580._4_4_;
    auVar73._0_4_ = fVar131 * (float)local_580._0_4_ * (float)local_580._0_4_;
    auVar73._8_4_ = fVar140 * fStack_578 * fStack_578;
    auVar73._12_4_ = fVar141 * fStack_574 * fStack_574;
    auVar73._16_4_ = fVar142 * fStack_570 * fStack_570;
    auVar73._20_4_ = fVar143 * fStack_56c * fStack_56c;
    auVar73._24_4_ = fVar144 * fStack_568 * fStack_568;
    auVar73._28_4_ = uStack_564;
    auVar166 = vcmpps_avx(auVar115,auVar73,1);
    auVar92 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar214 = vandnps_avx(auVar136,auVar187);
    auVar74._4_4_ = fVar190 * -fVar219;
    auVar74._0_4_ = fVar181 * -fVar216;
    auVar74._8_4_ = fVar191 * -fVar220;
    auVar74._12_4_ = fVar192 * -fVar221;
    auVar74._16_4_ = fVar193 * -fVar222;
    auVar74._20_4_ = fVar194 * -fVar223;
    auVar74._24_4_ = fVar195 * -fVar224;
    auVar74._28_4_ = auVar93._28_4_ + auVar113._28_4_;
    auVar166 = vblendvps_avx(auVar151,auVar74,auVar166);
    auVar214 = vblendvps_avx(auVar151,auVar166,auVar214);
    auVar213 = vmaxps_avx(auVar174,auVar214);
    auVar166 = vcmpps_avx(auVar151,auVar213,0);
    auVar162._8_4_ = 0xff800000;
    auVar162._0_8_ = 0xff800000ff800000;
    auVar162._12_4_ = 0xff800000;
    auVar162._16_4_ = 0xff800000;
    auVar162._20_4_ = 0xff800000;
    auVar162._24_4_ = 0xff800000;
    auVar162._28_4_ = 0xff800000;
    auVar166 = vblendvps_avx(auVar213,auVar162,auVar166);
    auVar213 = vminps_avx(auVar174,auVar214);
    auVar214 = vcmpps_avx(auVar151,auVar213,0);
    auVar214 = vblendvps_avx(auVar213,auVar162,auVar214);
    auVar217 = vminps_avx(local_300,auVar213);
    auVar213 = vcmpps_avx(auVar217,auVar213,0);
    auVar214 = vblendvps_avx(auVar214,auVar166,auVar213);
    auVar137._16_16_ = auVar92;
    auVar137._0_16_ = auVar92;
    local_1e0 = vmaxps_avx(local_520,auVar214);
    auVar116._0_4_ = fVar108 + auVar217._0_4_;
    auVar116._4_4_ = fVar119 + auVar217._4_4_;
    auVar116._8_4_ = fStack_5d8 + auVar217._8_4_;
    auVar116._12_4_ = fStack_5d4 + auVar217._12_4_;
    auVar116._16_4_ = fStack_5d0 + auVar217._16_4_;
    auVar116._20_4_ = fStack_5cc + auVar217._20_4_;
    auVar116._24_4_ = fStack_5c8 + auVar217._24_4_;
    auVar116._28_4_ = fStack_5c4 + auVar217._28_4_;
    auVar214 = vcmpps_avx(auVar137,auVar116,2);
    auVar92 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0);
    auVar147._16_16_ = auVar92;
    auVar147._0_16_ = auVar92;
    auVar166 = vcmpps_avx(auVar116,auVar147,2);
    auVar214 = vandps_avx(auVar166,auVar214);
    auVar166 = vcmpps_avx(auVar151,auVar217,4);
    auVar166 = vandps_avx(auVar187,auVar166);
    local_420 = vandps_avx(auVar214,auVar166);
    local_580._0_4_ = fVar108 + local_1e0._0_4_;
    local_580._4_4_ = fVar119 + local_1e0._4_4_;
    fStack_578 = fStack_5d8 + local_1e0._8_4_;
    fStack_574 = fStack_5d4 + local_1e0._12_4_;
    fStack_570 = fStack_5d0 + local_1e0._16_4_;
    fStack_56c = fStack_5cc + local_1e0._20_4_;
    fStack_568 = fStack_5c8 + local_1e0._24_4_;
    fStack_184 = local_1e0._28_4_;
    uStack_564 = fStack_5c4 + fStack_184;
    auVar214 = vcmpps_avx(auVar137,_local_580,2);
    auVar166 = vcmpps_avx(_local_580,auVar147,2);
    auVar214 = vandps_avx(auVar166,auVar214);
    auVar166 = vcmpps_avx(auVar162,local_1e0,4);
    auVar166 = vandps_avx(auVar187,auVar166);
    local_440 = vandps_avx(auVar214,auVar166);
    local_600 = vorps_avx(local_420,local_440);
    if ((((((((local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_600 >> 0x7f,0) != '\0') ||
          (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_600 >> 0xbf,0) != '\0') ||
        (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_600[0x1f] < '\0') {
      auVar213 = vblendvps_avx(local_1e0,auVar217,local_420);
      auVar217 = vblendvps_avx(_local_460,auVar173,local_420);
      auVar214 = vrcpps_avx(_local_2e0);
      local_540 = auVar214._0_4_;
      fStack_53c = auVar214._4_4_;
      auVar75._4_4_ = (float)local_2e0._4_4_ * fStack_53c;
      auVar75._0_4_ = (float)local_2e0._0_4_ * local_540;
      fStack_538 = auVar214._8_4_;
      auVar75._8_4_ = fStack_2d8 * fStack_538;
      fStack_534 = auVar214._12_4_;
      auVar75._12_4_ = fStack_2d4 * fStack_534;
      fStack_530 = auVar214._16_4_;
      auVar75._16_4_ = fStack_2d0 * fStack_530;
      fStack_52c = auVar214._20_4_;
      auVar75._20_4_ = fStack_2cc * fStack_52c;
      fStack_528 = auVar214._24_4_;
      auVar75._24_4_ = fStack_2c8 * fStack_528;
      auVar75._28_4_ = local_420._28_4_;
      auVar163._8_4_ = 0x3f800000;
      auVar163._0_8_ = 0x3f8000003f800000;
      auVar163._12_4_ = 0x3f800000;
      auVar163._16_4_ = 0x3f800000;
      auVar163._20_4_ = 0x3f800000;
      auVar163._24_4_ = 0x3f800000;
      auVar163._28_4_ = 0x3f800000;
      auVar166 = vsubps_avx(auVar163,auVar75);
      local_540 = local_540 + local_540 * auVar166._0_4_;
      fStack_53c = fStack_53c + fStack_53c * auVar166._4_4_;
      fStack_538 = fStack_538 + fStack_538 * auVar166._8_4_;
      fStack_534 = fStack_534 + fStack_534 * auVar166._12_4_;
      fStack_530 = fStack_530 + fStack_530 * auVar166._16_4_;
      fStack_52c = fStack_52c + fStack_52c * auVar166._20_4_;
      fStack_528 = fStack_528 + fStack_528 * auVar166._24_4_;
      fStack_524 = auVar214._28_4_ + auVar166._28_4_;
      fVar170 = (float)local_2e0._0_4_ * fVar125 * fVar170;
      fVar105 = (float)local_2e0._4_4_ * fVar17 * fVar105;
      fVar106 = fStack_2d8 * fVar91 * fVar106;
      fVar177 = fStack_2d4 * fVar101 * fVar177;
      fVar178 = fStack_2d0 * fVar102 * fVar178;
      fVar179 = fStack_2cc * fVar103 * fVar179;
      fVar180 = fStack_2c8 * fVar104 * fVar180;
      auVar214 = vcmpps_avx(auVar213,local_300,0);
      auVar166 = vcmpps_avx(auVar213,local_520,0);
      auVar214 = vorps_avx(auVar214,auVar166);
      auVar214 = vandps_avx(auVar187,auVar214);
      _local_2e0 = auVar174;
      auVar93 = vcmpps_avx(auVar174,auVar213,0);
      auVar166 = vandps_avx(auVar187,auVar93);
      fVar91 = auVar213._0_4_;
      fVar101 = auVar213._4_4_;
      fVar102 = auVar213._8_4_;
      fVar103 = auVar213._12_4_;
      fVar104 = auVar213._16_4_;
      fVar139 = auVar213._20_4_;
      fVar140 = auVar213._24_4_;
      local_200 = fVar107 * fVar170;
      fStack_1fc = fVar13 * fVar105;
      fStack_1f8 = fVar20 * fVar106;
      fStack_1f4 = fVar26 * fVar177;
      fStack_1f0 = fVar32 * fVar178;
      fStack_1ec = fVar38 * fVar179;
      fStack_1e8 = fVar44 * fVar180;
      fStack_1e4 = -INFINITY;
      auVar138._0_4_ = fVar107 * fVar170 + fVar150 * (fVar91 * local_5c0 + fVar123);
      auVar138._4_4_ = fVar13 * fVar105 + fVar154 * (fVar101 * local_5c0 + fVar16);
      auVar138._8_4_ = fVar20 * fVar106 + fVar155 * (fVar102 * local_5c0 + fVar23);
      auVar138._12_4_ = fVar26 * fVar177 + fVar156 * (fVar103 * local_5c0 + fVar29);
      auVar138._16_4_ = fVar32 * fVar178 + fVar157 * (fVar104 * local_5c0 + fVar35);
      auVar138._20_4_ = fVar38 * fVar179 + fVar158 * (fVar139 * local_5c0 + fVar41);
      auVar138._24_4_ = fVar44 * fVar180 + fVar159 * (fVar140 * local_5c0 + fVar47);
      auVar138._28_4_ = auVar93._28_4_ + fStack_164 + -INFINITY;
      fStack_23c = fVar13 * fVar120;
      local_240 = fVar107 * fVar109;
      fStack_238 = fVar20 * fVar122;
      fStack_234 = fVar26 * fVar124;
      fStack_230 = fVar32 * fVar126;
      fStack_22c = fVar38 * fVar128;
      fStack_228 = fVar44 * fVar130;
      uStack_224 = auVar174._28_4_;
      fVar131 = auVar217._0_4_;
      fVar123 = auVar217._4_4_;
      auVar76._4_4_ = fVar13 * fVar120 * fVar123;
      auVar76._0_4_ = fVar107 * fVar109 * fVar131;
      fVar107 = auVar217._8_4_;
      auVar76._8_4_ = fVar20 * fVar122 * fVar107;
      fVar125 = auVar217._12_4_;
      auVar76._12_4_ = fVar26 * fVar124 * fVar125;
      fVar13 = auVar217._16_4_;
      auVar76._16_4_ = fVar32 * fVar126 * fVar13;
      fVar16 = auVar217._20_4_;
      auVar76._20_4_ = fVar38 * fVar128 * fVar16;
      fVar17 = auVar217._24_4_;
      auVar76._24_4_ = fVar44 * fVar130 * fVar17;
      auVar76._28_4_ = 0xff800000;
      auVar187 = vsubps_avx(auVar138,auVar76);
      local_220 = fVar201 * fVar170;
      fStack_21c = fVar129 * fVar105;
      fStack_218 = fVar19 * fVar106;
      fStack_214 = fVar25 * fVar177;
      fStack_210 = fVar31 * fVar178;
      fStack_20c = fVar37 * fVar179;
      fStack_208 = fVar43 * fVar180;
      fStack_204 = INFINITY;
      auVar186._0_4_ = fVar201 * fVar170 + fVar150 * (fVar91 * local_3e0 + fVar121);
      auVar186._4_4_ = fVar129 * fVar105 + fVar154 * (fVar101 * local_3e0 + fVar15);
      auVar186._8_4_ = fVar19 * fVar106 + fVar155 * (fVar102 * local_3e0 + fVar22);
      auVar186._12_4_ = fVar25 * fVar177 + fVar156 * (fVar103 * local_3e0 + fVar28);
      auVar186._16_4_ = fVar31 * fVar178 + fVar157 * (fVar104 * local_3e0 + fVar34);
      auVar186._20_4_ = fVar37 * fVar179 + fVar158 * (fVar139 * local_3e0 + fVar40);
      auVar186._24_4_ = fVar43 * fVar180 + fVar159 * (fVar140 * local_3e0 + fVar46);
      auVar186._28_4_ = (float)local_400._28_4_ + -INFINITY + INFINITY;
      fStack_1bc = fVar129 * fVar120;
      local_1c0 = fVar201 * fVar109;
      fStack_1b8 = fVar19 * fVar122;
      fStack_1b4 = fVar25 * fVar124;
      fStack_1b0 = fVar31 * fVar126;
      fStack_1ac = fVar37 * fVar128;
      fStack_1a8 = fVar43 * fVar130;
      uStack_1a4 = local_600._28_4_;
      auVar77._4_4_ = fVar129 * fVar120 * fVar123;
      auVar77._0_4_ = fVar201 * fVar109 * fVar131;
      auVar77._8_4_ = fVar19 * fVar122 * fVar107;
      auVar77._12_4_ = fVar25 * fVar124 * fVar125;
      auVar77._16_4_ = fVar31 * fVar126 * fVar13;
      auVar77._20_4_ = fVar37 * fVar128 * fVar16;
      auVar77._24_4_ = fVar43 * fVar130 * fVar17;
      auVar77._28_4_ = local_600._28_4_;
      auVar93 = vsubps_avx(auVar186,auVar77);
      local_c0._0_8_ = local_620._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar20;
      local_c0._12_4_ = -fVar26;
      local_c0._16_4_ = -fVar32;
      local_c0._20_4_ = -fVar38;
      local_c0._24_4_ = -fVar44;
      local_c0._28_4_ = -local_620._28_4_;
      auVar174 = vblendvps_avx(local_620,local_c0,auVar166);
      local_360 = vblendvps_avx(auVar174,auVar187,auVar214);
      auVar226 = ZEXT3264(local_2a0);
      auVar218 = ZEXT3264(local_2c0);
      local_80 = fVar199 * fVar170;
      fStack_7c = fVar127 * fVar105;
      fStack_78 = fVar18 * fVar106;
      fStack_74 = fVar24 * fVar177;
      fStack_70 = fVar30 * fVar178;
      fStack_6c = fVar36 * fVar179;
      fStack_68 = fVar42 * fVar180;
      fStack_64 = auVar174._28_4_;
      auVar152._0_4_ = fVar199 * fVar170 + fVar150 * (fVar118 + local_260 * fVar91);
      auVar152._4_4_ = fVar127 * fVar105 + fVar154 * (fVar14 + local_260 * fVar101);
      auVar152._8_4_ = fVar18 * fVar106 + fVar155 * (fVar21 + local_260 * fVar102);
      auVar152._12_4_ = fVar24 * fVar177 + fVar156 * (fVar27 + local_260 * fVar103);
      auVar152._16_4_ = fVar30 * fVar178 + fVar157 * (fVar33 + local_260 * fVar104);
      auVar152._20_4_ = fVar36 * fVar179 + fVar158 * (fVar39 + local_260 * fVar139);
      auVar152._24_4_ = fVar42 * fVar180 + fVar159 * (fVar45 + local_260 * fVar140);
      auVar152._28_4_ = auVar174._28_4_ + local_2c0._28_4_ + local_c0._28_4_;
      local_1a0 = fVar199 * fVar109;
      fStack_19c = fVar127 * fVar120;
      fStack_198 = fVar18 * fVar122;
      fStack_194 = fVar24 * fVar124;
      fStack_190 = fVar30 * fVar126;
      fStack_18c = fVar36 * fVar128;
      fStack_188 = fVar42 * fVar130;
      auVar78._4_4_ = fVar127 * fVar120 * fVar123;
      auVar78._0_4_ = fVar199 * fVar109 * fVar131;
      auVar78._8_4_ = fVar18 * fVar122 * fVar107;
      auVar78._12_4_ = fVar24 * fVar124 * fVar125;
      auVar78._16_4_ = fVar30 * fVar126 * fVar13;
      auVar78._20_4_ = fVar36 * fVar128 * fVar16;
      auVar78._24_4_ = fVar42 * fVar130 * fVar17;
      auVar78._28_4_ = fStack_184;
      local_e0._0_8_ = local_280._0_8_ ^ 0x8000000080000000;
      local_e0._8_4_ = -fVar19;
      local_e0._12_4_ = -fVar25;
      local_e0._16_4_ = -fVar31;
      local_e0._20_4_ = -fVar37;
      local_e0._24_4_ = -fVar43;
      local_e0._28_4_ = local_280._28_4_ ^ 0x80000000;
      auVar174 = vblendvps_avx(local_280,local_e0,auVar166);
      auVar187 = vsubps_avx(auVar152,auVar78);
      local_340 = vblendvps_avx(auVar174,auVar93,auVar214);
      local_100._0_8_ = local_2a0._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar18;
      local_100._12_4_ = -fVar24;
      local_100._16_4_ = -fVar30;
      local_100._20_4_ = -fVar36;
      local_100._24_4_ = -fVar42;
      local_100._28_4_ = -fVar50;
      auVar174 = vblendvps_avx(local_2a0,local_100,auVar166);
      local_320 = vblendvps_avx(auVar174,auVar187,auVar214);
      auVar148._8_4_ = 0x3f800000;
      auVar148._0_8_ = 0x3f8000003f800000;
      auVar148._12_4_ = 0x3f800000;
      auVar148._16_4_ = 0x3f800000;
      auVar148._20_4_ = 0x3f800000;
      auVar148._24_4_ = 0x3f800000;
      auVar148._28_4_ = 0x3f800000;
      local_a0 = vblendvps_avx(auVar148,ZEXT832(0) << 0x20,auVar166);
      auVar79._4_4_ = fVar123 * fStack_53c;
      auVar79._0_4_ = fVar131 * local_540;
      auVar79._8_4_ = fVar107 * fStack_538;
      auVar79._12_4_ = fVar125 * fStack_534;
      auVar79._16_4_ = fVar13 * fStack_530;
      auVar79._20_4_ = fVar16 * fStack_52c;
      auVar79._24_4_ = fVar17 * fStack_528;
      auVar79._28_4_ = auVar217._28_4_;
      local_3c0 = vblendvps_avx(local_a0,auVar79,auVar214);
      auVar149._0_4_ = fVar91 + fVar108;
      auVar149._4_4_ = fVar101 + fVar119;
      auVar149._8_4_ = fVar102 + fStack_5d8;
      auVar149._12_4_ = fVar103 + fStack_5d4;
      auVar149._16_4_ = fVar104 + fStack_5d0;
      auVar149._20_4_ = fVar139 + fStack_5cc;
      auVar149._24_4_ = fVar140 + fStack_5c8;
      auVar149._28_4_ = auVar213._28_4_ + fStack_5c4;
      local_3a0 = ZEXT832(0) << 0x20;
      local_380 = auVar149;
      auVar98._8_4_ = 0x7f800000;
      auVar98._0_8_ = 0x7f8000007f800000;
      auVar98._12_4_ = 0x7f800000;
      auVar98._16_4_ = 0x7f800000;
      auVar98._20_4_ = 0x7f800000;
      auVar98._24_4_ = 0x7f800000;
      auVar98._28_4_ = 0x7f800000;
      auVar214 = vblendvps_avx(auVar98,auVar149,local_600);
      auVar166 = vshufps_avx(auVar214,auVar214,0xb1);
      auVar166 = vminps_avx(auVar214,auVar166);
      auVar174 = vshufpd_avx(auVar166,auVar166,5);
      auVar166 = vminps_avx(auVar166,auVar174);
      auVar174 = vperm2f128_avx(auVar166,auVar166,1);
      auVar166 = vminps_avx(auVar166,auVar174);
      auVar166 = vcmpps_avx(auVar214,auVar166,0);
      auVar174 = local_600 & auVar166;
      auVar176 = ZEXT3264(CONCAT428(local_5c0,
                                    CONCAT424(local_5c0,
                                              CONCAT420(local_5c0,
                                                        CONCAT416(local_5c0,
                                                                  CONCAT412(local_5c0,
                                                                            CONCAT48(local_5c0,
                                                                                     CONCAT44(
                                                  local_5c0,local_5c0))))))));
      auVar189 = ZEXT3264(CONCAT428(local_3e0,
                                    CONCAT424(local_3e0,
                                              CONCAT420(local_3e0,
                                                        CONCAT416(local_3e0,
                                                                  CONCAT412(local_3e0,
                                                                            CONCAT48(local_3e0,
                                                                                     CONCAT44(
                                                  local_3e0,local_3e0))))))));
      auVar198 = ZEXT3264(CONCAT428(local_260,
                                    CONCAT424(local_260,
                                              CONCAT420(local_260,
                                                        CONCAT416(local_260,
                                                                  CONCAT412(local_260,
                                                                            CONCAT48(local_260,
                                                                                     CONCAT44(
                                                  local_260,local_260))))))));
      auVar168 = ZEXT3264(local_280);
      auVar200 = ZEXT3264(local_400);
      auVar214 = local_600;
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar174 >> 0x7f,0) != '\0') ||
            (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar174 >> 0xbf,0) != '\0') ||
          (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar174[0x1f] < '\0') {
        auVar214 = vandps_avx(local_600,auVar166);
      }
      uVar85 = vmovmskps_avx(auVar214);
      uVar86 = 0;
      if (uVar85 != 0) {
        for (; (uVar85 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
        }
      }
      pauVar89 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar214 = vcmpps_avx(local_280,local_280,0xf);
      auVar215 = ZEXT3264(auVar214);
      auStack_590 = local_600._16_16_;
      local_5a0._8_8_ = 0x100000001;
      local_5a0._0_8_ = 0x100000001;
      auVar153 = ZEXT3264(local_620);
      auVar204 = ZEXT3264(auVar98);
      local_658 = pSVar90;
      fStack_5bc = local_5c0;
      fStack_5b8 = local_5c0;
      fStack_5b4 = local_5c0;
      fStack_5b0 = local_5c0;
      fStack_5ac = local_5c0;
      fStack_5a8 = local_5c0;
      fStack_5a4 = local_5c0;
      local_400 = auVar96;
      _local_180 = auVar132;
      while( true ) {
        auVar187 = auVar189._0_32_;
        auVar174 = auVar176._0_32_;
        local_650.hit = (RTCHitN *)local_4f0;
        local_650.valid = (int *)local_670;
        auVar196 = auVar198._0_28_;
        auVar93 = auVar226._0_32_;
        auVar166 = auVar168._0_32_;
        auVar214 = auVar153._0_32_;
        auVar213 = auVar200._0_32_;
        auVar217 = auVar218._0_32_;
        uVar87 = (ulong)uVar86;
        uVar86 = *(uint *)(local_160 + uVar87 * 4);
        pGVar10 = (pSVar90->geometries).items[uVar86].ptr;
        local_650.ray = (RTCRayN *)ray;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_600 + uVar87 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar1 = *(undefined4 *)(local_3c0 + uVar87 * 4);
            uVar2 = *(undefined4 *)(local_3a0 + uVar87 * 4);
            uVar85 = *(uint *)(local_380 + uVar87 * 4);
            *(uint *)(ray + k * 4 + 0x80) = uVar85;
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_360 + uVar87 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_340 + uVar87 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_320 + uVar87 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
            *(uint *)(ray + k * 4 + 0x110) = (line->primIDs).field_0.i[uVar87];
            *(uint *)(ray + k * 4 + 0x120) = uVar86;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            local_660 = line;
            goto LAB_0095e738;
          }
          local_4c0 = *(undefined4 *)(local_3c0 + uVar87 * 4);
          local_4b0 = *(undefined4 *)(local_3a0 + uVar87 * 4);
          local_490 = vpshufd_avx(ZEXT416(uVar86),0);
          local_4a0 = (line->primIDs).field_0.i[uVar87];
          local_4f0._4_4_ = *(undefined4 *)(local_360 + uVar87 * 4);
          uVar1 = *(undefined4 *)(local_340 + uVar87 * 4);
          auVar92._4_4_ = uVar1;
          auVar92._0_4_ = uVar1;
          auVar92._8_4_ = uVar1;
          auVar92._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_320 + uVar87 * 4);
          local_4d0._4_4_ = uVar1;
          local_4d0._0_4_ = uVar1;
          local_4d0._8_4_ = uVar1;
          local_4d0._12_4_ = uVar1;
          local_4f0._0_4_ = local_4f0._4_4_;
          local_4f0._8_4_ = local_4f0._4_4_;
          local_4f0._12_4_ = local_4f0._4_4_;
          local_4e0 = auVar92;
          uStack_4bc = local_4c0;
          uStack_4b8 = local_4c0;
          uStack_4b4 = local_4c0;
          uStack_4ac = local_4b0;
          uStack_4a8 = local_4b0;
          uStack_4a4 = local_4b0;
          uStack_49c = local_4a0;
          uStack_498 = local_4a0;
          uStack_494 = local_4a0;
          uStack_47c = context->user->instID[0];
          local_480 = uStack_47c;
          uStack_478 = uStack_47c;
          uStack_474 = uStack_47c;
          uStack_470 = context->user->instPrimID[0];
          uStack_46c = uStack_470;
          uStack_468 = uStack_470;
          uStack_464 = uStack_470;
          local_130 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_380 + uVar87 * 4);
          local_670 = *pauVar89;
          local_650.geometryUserPtr = pGVar10->userPtr;
          local_650.context = context->user;
          local_650.N = 4;
          local_5e0 = pauVar89;
          local_560 = auVar149;
          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar214 = ZEXT1632(auVar215._0_16_);
            local_660 = line;
            (*pGVar10->intersectionFilterN)(&local_650);
            auVar214 = vcmpps_avx(auVar214,auVar214,0xf);
            auVar215 = ZEXT3264(auVar214);
            auVar218 = ZEXT3264(local_2c0);
            auVar200 = ZEXT3264(local_400);
            auVar226 = ZEXT3264(local_2a0);
            auVar168 = ZEXT3264(local_280);
            auVar198 = ZEXT3264(CONCAT428(fStack_244,
                                          CONCAT424(fStack_248,
                                                    CONCAT420(fStack_24c,
                                                              CONCAT416(fStack_250,
                                                                        CONCAT412(fStack_254,
                                                                                  CONCAT48(
                                                  fStack_258,CONCAT44(fStack_25c,local_260))))))));
            auVar189 = ZEXT3264(CONCAT428(fStack_3c4,
                                          CONCAT424(fStack_3c8,
                                                    CONCAT420(fStack_3cc,
                                                              CONCAT416(fStack_3d0,
                                                                        CONCAT412(fStack_3d4,
                                                                                  CONCAT48(
                                                  fStack_3d8,CONCAT44(fStack_3dc,local_3e0))))))));
            auVar176 = ZEXT3264(CONCAT428(fStack_5a4,
                                          CONCAT424(fStack_5a8,
                                                    CONCAT420(fStack_5ac,
                                                              CONCAT416(fStack_5b0,
                                                                        CONCAT412(fStack_5b4,
                                                                                  CONCAT48(
                                                  fStack_5b8,CONCAT44(fStack_5bc,local_5c0))))))));
            auVar204 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            pSVar90 = local_658;
            line = local_660;
          }
          if (local_670 == (undefined1  [16])0x0) {
            auVar111 = ZEXT816(0);
            auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,auVar111);
            auVar111 = vpcmpeqd_avx(auVar111,auVar111);
            auVar92 = auVar92 ^ auVar111;
            auVar153 = ZEXT3264(local_620);
            pauVar89 = local_5e0;
          }
          else {
            p_Var12 = context->args->filter;
            auVar153 = ZEXT3264(local_620);
            auVar110 = ZEXT816(0);
            auVar111 = vpcmpeqd_avx(auVar92,auVar92);
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              auVar214 = ZEXT1632(auVar215._0_16_);
              (*p_Var12)(&local_650);
              auVar111 = vpcmpeqd_avx(auVar111,auVar111);
              auVar110 = ZEXT816(0) << 0x40;
              auVar214 = vcmpps_avx(auVar214,auVar214,0xf);
              auVar215 = ZEXT3264(auVar214);
              auVar153 = ZEXT3264(local_620);
              auVar218 = ZEXT3264(local_2c0);
              auVar200 = ZEXT3264(local_400);
              auVar226 = ZEXT3264(local_2a0);
              auVar168 = ZEXT3264(local_280);
              auVar198 = ZEXT3264(CONCAT428(fStack_244,
                                            CONCAT424(fStack_248,
                                                      CONCAT420(fStack_24c,
                                                                CONCAT416(fStack_250,
                                                                          CONCAT412(fStack_254,
                                                                                    CONCAT48(
                                                  fStack_258,CONCAT44(fStack_25c,local_260))))))));
              auVar189 = ZEXT3264(CONCAT428(fStack_3c4,
                                            CONCAT424(fStack_3c8,
                                                      CONCAT420(fStack_3cc,
                                                                CONCAT416(fStack_3d0,
                                                                          CONCAT412(fStack_3d4,
                                                                                    CONCAT48(
                                                  fStack_3d8,CONCAT44(fStack_3dc,local_3e0))))))));
              auVar176 = ZEXT3264(CONCAT428(fStack_5a4,
                                            CONCAT424(fStack_5a8,
                                                      CONCAT420(fStack_5ac,
                                                                CONCAT416(fStack_5b0,
                                                                          CONCAT412(fStack_5b4,
                                                                                    CONCAT48(
                                                  fStack_5b8,CONCAT44(fStack_5bc,local_5c0))))))));
              auVar204 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              pSVar90 = local_658;
            }
            auVar110 = vpcmpeqd_avx(local_670,auVar110);
            auVar92 = auVar110 ^ auVar111;
            pauVar89 = local_5e0;
            if (local_670 != (undefined1  [16])0x0) {
              auVar110 = auVar110 ^ auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])local_650.hit);
              *(undefined1 (*) [16])(local_650.ray + 0xc0) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x10));
              *(undefined1 (*) [16])(local_650.ray + 0xd0) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x20));
              *(undefined1 (*) [16])(local_650.ray + 0xe0) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x30));
              *(undefined1 (*) [16])(local_650.ray + 0xf0) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x40));
              *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x50));
              *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x60));
              *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x70));
              *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar111;
              auVar111 = vmaskmovps_avx(auVar110,*(undefined1 (*) [16])(local_650.hit + 0x80));
              *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar111;
            }
          }
          auVar149 = local_560;
          if ((local_5a0 & auVar92) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = local_130._0_4_;
            auVar92 = local_130;
          }
          else {
            auVar92 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_600 + uVar87 * 4) = 0;
          auVar92 = vshufps_avx(auVar92,auVar92,0);
          auVar99._16_16_ = auVar92;
          auVar99._0_16_ = auVar92;
          auVar214 = vcmpps_avx(auVar149,auVar99,2);
          local_600 = vandps_avx(auVar214,local_600);
        }
        auVar187 = auVar189._0_32_;
        auVar174 = auVar176._0_32_;
        auVar196 = auVar198._0_28_;
        auVar93 = auVar226._0_32_;
        auVar166 = auVar168._0_32_;
        auVar214 = auVar153._0_32_;
        auVar213 = auVar200._0_32_;
        auVar217 = auVar218._0_32_;
        if ((((((((local_600 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_600 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_600 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_600 >> 0x7f,0) == '\0') &&
              (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_600 >> 0xbf,0) == '\0') &&
            (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_600[0x1f]) break;
        auVar214 = vblendvps_avx(auVar204._0_32_,auVar149,local_600);
        auVar166 = vshufps_avx(auVar214,auVar214,0xb1);
        auVar166 = vminps_avx(auVar214,auVar166);
        auVar174 = vshufpd_avx(auVar166,auVar166,5);
        auVar166 = vminps_avx(auVar166,auVar174);
        auVar174 = vperm2f128_avx(auVar166,auVar166,1);
        auVar166 = vminps_avx(auVar166,auVar174);
        auVar166 = vcmpps_avx(auVar214,auVar166,0);
        auVar174 = local_600 & auVar166;
        auVar214 = local_600;
        if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar174 >> 0x7f,0) != '\0') ||
              (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar174 >> 0xbf,0) != '\0') ||
            (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar174[0x1f] < '\0') {
          auVar214 = vandps_avx(auVar166,local_600);
        }
        uVar85 = vmovmskps_avx(auVar214);
        uVar86 = 0;
        if (uVar85 != 0) {
          for (; (uVar85 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
          }
        }
      }
      uVar85 = *(uint *)(ray + k * 4 + 0x80);
      local_660 = line;
LAB_0095e738:
      auVar168 = ZEXT464(uVar85);
      auVar94 = vandps_avx(local_440,local_420);
      auVar92 = vshufps_avx(ZEXT416(uVar85),ZEXT416(uVar85),0);
      auVar117._16_16_ = auVar92;
      auVar117._0_16_ = auVar92;
      auVar48 = vcmpps_avx(_local_580,auVar117,2);
      auVar49 = auVar94 & auVar48;
      if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar49 >> 0x7f,0) != '\0') ||
            (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar49 >> 0xbf,0) != '\0') ||
          (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar49[0x1f] < '\0') {
        auVar49 = vcmpps_avx(local_1e0,_local_2e0,0);
        auVar214 = vblendvps_avx(auVar214,local_c0,auVar49);
        auVar166 = vblendvps_avx(auVar166,local_e0,auVar49);
        auVar93 = vblendvps_avx(auVar93,local_100,auVar49);
        auVar49 = vcmpps_avx(local_1e0,local_300,0);
        auVar112 = vcmpps_avx(local_1e0,local_520,0);
        auVar49 = vorps_avx(auVar49,auVar112);
        fVar199 = local_1e0._0_4_;
        fVar201 = local_1e0._4_4_;
        fVar170 = local_1e0._8_4_;
        fVar131 = local_1e0._12_4_;
        fVar107 = local_1e0._16_4_;
        fVar118 = local_1e0._20_4_;
        fVar121 = local_1e0._24_4_;
        auVar167._0_4_ =
             (float)local_120._0_4_ * (fVar199 * auVar174._0_4_ + (float)local_180._0_4_) +
             local_200;
        auVar167._4_4_ =
             (float)local_120._4_4_ * (fVar201 * auVar174._4_4_ + (float)local_180._4_4_) +
             fStack_1fc;
        auVar167._8_4_ = fStack_118 * (fVar170 * auVar174._8_4_ + fStack_178) + fStack_1f8;
        auVar167._12_4_ = fStack_114 * (fVar131 * auVar174._12_4_ + fStack_174) + fStack_1f4;
        auVar167._16_4_ = fStack_110 * (fVar107 * auVar174._16_4_ + fStack_170) + fStack_1f0;
        auVar167._20_4_ = fStack_10c * (fVar118 * auVar174._20_4_ + fStack_16c) + fStack_1ec;
        auVar167._24_4_ = fStack_108 * (fVar121 * auVar174._24_4_ + fStack_168) + fStack_1e8;
        auVar167._28_4_ = auVar112._28_4_ + fStack_164 + fStack_1e4;
        auVar175._0_4_ =
             (float)local_120._0_4_ * (auVar213._0_4_ + auVar187._0_4_ * fVar199) + local_220;
        auVar175._4_4_ =
             (float)local_120._4_4_ * (auVar213._4_4_ + auVar187._4_4_ * fVar201) + fStack_21c;
        auVar175._8_4_ = fStack_118 * (auVar213._8_4_ + auVar187._8_4_ * fVar170) + fStack_218;
        auVar175._12_4_ = fStack_114 * (auVar213._12_4_ + auVar187._12_4_ * fVar131) + fStack_214;
        auVar175._16_4_ = fStack_110 * (auVar213._16_4_ + auVar187._16_4_ * fVar107) + fStack_210;
        auVar175._20_4_ = fStack_10c * (auVar213._20_4_ + auVar187._20_4_ * fVar118) + fStack_20c;
        auVar175._24_4_ = fStack_108 * (auVar213._24_4_ + auVar187._24_4_ * fVar121) + fStack_208;
        auVar175._28_4_ = auVar213._28_4_ + auVar174._28_4_ + fStack_204;
        auVar188._0_4_ =
             (float)local_120._0_4_ * (auVar217._0_4_ + auVar196._0_4_ * fVar199) + local_80;
        auVar188._4_4_ =
             (float)local_120._4_4_ * (auVar217._4_4_ + auVar196._4_4_ * fVar201) + fStack_7c;
        auVar188._8_4_ = fStack_118 * (auVar217._8_4_ + auVar196._8_4_ * fVar170) + fStack_78;
        auVar188._12_4_ = fStack_114 * (auVar217._12_4_ + auVar196._12_4_ * fVar131) + fStack_74;
        auVar188._16_4_ = fStack_110 * (auVar217._16_4_ + auVar196._16_4_ * fVar107) + fStack_70;
        auVar188._20_4_ = fStack_10c * (auVar217._20_4_ + auVar196._20_4_ * fVar118) + fStack_6c;
        auVar188._24_4_ = fStack_108 * (auVar217._24_4_ + auVar196._24_4_ * fVar121) + fStack_68;
        auVar188._28_4_ = auVar217._28_4_ + auVar187._28_4_ + fStack_64;
        auVar80._4_4_ = (float)local_460._4_4_ * fStack_23c;
        auVar80._0_4_ = (float)local_460._0_4_ * local_240;
        auVar80._8_4_ = fStack_458 * fStack_238;
        auVar80._12_4_ = fStack_454 * fStack_234;
        auVar80._16_4_ = fStack_450 * fStack_230;
        auVar80._20_4_ = fStack_44c * fStack_22c;
        auVar80._24_4_ = fStack_448 * fStack_228;
        auVar80._28_4_ = uStack_104;
        auVar174 = vsubps_avx(auVar167,auVar80);
        auVar81._4_4_ = (float)local_460._4_4_ * fStack_1bc;
        auVar81._0_4_ = (float)local_460._0_4_ * local_1c0;
        auVar81._8_4_ = fStack_458 * fStack_1b8;
        auVar81._12_4_ = fStack_454 * fStack_1b4;
        auVar81._16_4_ = fStack_450 * fStack_1b0;
        auVar81._20_4_ = fStack_44c * fStack_1ac;
        auVar81._24_4_ = fStack_448 * fStack_1a8;
        auVar81._28_4_ = uStack_104;
        auVar187 = vsubps_avx(auVar175,auVar81);
        auVar111._0_4_ = (float)local_460._0_4_ * local_1a0;
        auVar111._4_4_ = (float)local_460._4_4_ * fStack_19c;
        auVar111._8_4_ = fStack_458 * fStack_198;
        auVar111._12_4_ = fStack_454 * fStack_194;
        auVar82._16_4_ = fStack_450 * fStack_190;
        auVar82._0_16_ = auVar111;
        auVar82._20_4_ = fStack_44c * fStack_18c;
        auVar82._24_4_ = fStack_448 * fStack_188;
        auVar82._28_4_ = uStack_104;
        auVar213 = vsubps_avx(auVar188,auVar82);
        local_360 = vblendvps_avx(auVar214,auVar174,auVar49);
        local_340 = vblendvps_avx(auVar166,auVar187,auVar49);
        local_320 = vblendvps_avx(auVar93,auVar213,auVar49);
        auVar83._4_4_ = (float)local_460._4_4_ * fStack_53c;
        auVar83._0_4_ = (float)local_460._0_4_ * local_540;
        auVar83._8_4_ = fStack_458 * fStack_538;
        auVar83._12_4_ = fStack_454 * fStack_534;
        auVar83._16_4_ = fStack_450 * fStack_530;
        auVar83._20_4_ = fStack_44c * fStack_52c;
        auVar83._24_4_ = fStack_448 * fStack_528;
        auVar83._28_4_ = auVar174._28_4_;
        local_3c0 = vblendvps_avx(local_a0,auVar83,auVar49);
        local_600 = vandps_avx(auVar48,auVar94);
        local_3a0 = ZEXT832(0) << 0x20;
        local_380 = _local_580;
        auVar214 = vblendvps_avx(auVar204._0_32_,_local_580,local_600);
        auVar166 = vshufps_avx(auVar214,auVar214,0xb1);
        auVar166 = vminps_avx(auVar214,auVar166);
        auVar174 = vshufpd_avx(auVar166,auVar166,5);
        auVar166 = vminps_avx(auVar166,auVar174);
        auVar174 = vperm2f128_avx(auVar166,auVar166,1);
        auVar166 = vminps_avx(auVar166,auVar174);
        auVar166 = vcmpps_avx(auVar214,auVar166,0);
        pSVar90 = context->scene;
        auVar174 = local_600 & auVar166;
        auVar214 = local_600;
        if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar174 >> 0x7f,0) != '\0') ||
              (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar174 >> 0xbf,0) != '\0') ||
            (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar174[0x1f] < '\0') {
          auVar214 = vandps_avx(auVar166,local_600);
        }
        uVar85 = vmovmskps_avx(auVar214);
        uVar86 = 0;
        if (uVar85 != 0) {
          for (; (uVar85 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
          }
        }
        auVar214 = vcmpps_avx(local_a0,local_a0,0xf);
        auVar176 = ZEXT3264(auVar214);
        auVar189 = ZEXT864(0) << 0x20;
        auVar92 = vpcmpeqd_avx(auVar111,auVar111);
        auVar198 = ZEXT1664(auVar92);
        do {
          local_650.hit = (RTCHitN *)local_4f0;
          local_650.valid = (int *)local_670;
          uVar87 = (ulong)uVar86;
          uVar86 = *(uint *)(local_160 + uVar87 * 4);
          pGVar10 = (pSVar90->geometries).items[uVar86].ptr;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_600 + uVar87 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar1 = *(undefined4 *)(local_3c0 + uVar87 * 4);
              uVar2 = *(undefined4 *)(local_3a0 + uVar87 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_380 + uVar87 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_360 + uVar87 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_340 + uVar87 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_320 + uVar87 * 4);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
              *(uint *)(ray + k * 4 + 0x110) = (local_660->primIDs).field_0.i[uVar87];
              *(uint *)(ray + k * 4 + 0x120) = uVar86;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              return;
            }
            local_4c0 = *(undefined4 *)(local_3c0 + uVar87 * 4);
            local_4b0 = *(undefined4 *)(local_3a0 + uVar87 * 4);
            local_490 = vpshufd_avx(ZEXT416(uVar86),0);
            local_4a0 = (local_660->primIDs).field_0.i[uVar87];
            uVar1 = *(undefined4 *)(local_360 + uVar87 * 4);
            local_4f0._4_4_ = uVar1;
            local_4f0._0_4_ = uVar1;
            local_4f0._8_4_ = uVar1;
            local_4f0._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_340 + uVar87 * 4);
            local_4e0._4_4_ = uVar1;
            local_4e0._0_4_ = uVar1;
            local_4e0._8_4_ = uVar1;
            local_4e0._12_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_320 + uVar87 * 4);
            local_4d0._4_4_ = uVar1;
            local_4d0._0_4_ = uVar1;
            local_4d0._8_4_ = uVar1;
            local_4d0._12_4_ = uVar1;
            uStack_4bc = local_4c0;
            uStack_4b8 = local_4c0;
            uStack_4b4 = local_4c0;
            uStack_4ac = local_4b0;
            uStack_4a8 = local_4b0;
            uStack_4a4 = local_4b0;
            uStack_49c = local_4a0;
            uStack_498 = local_4a0;
            uStack_494 = local_4a0;
            uStack_47c = context->user->instID[0];
            local_480 = uStack_47c;
            uStack_478 = uStack_47c;
            uStack_474 = uStack_47c;
            uStack_470 = context->user->instPrimID[0];
            uStack_46c = uStack_470;
            uStack_468 = uStack_470;
            uStack_464 = uStack_470;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_380 + uVar87 * 4);
            local_670 = *pauVar89;
            local_650.geometryUserPtr = pGVar10->userPtr;
            local_650.context = context->user;
            local_650.N = 4;
            local_620._0_16_ = auVar168._0_16_;
            local_5c0 = SUB84(pSVar90,0);
            fStack_5bc = (float)((ulong)pSVar90 >> 0x20);
            local_650.ray = (RTCRayN *)ray;
            local_5e0 = pauVar89;
            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar214 = ZEXT1632(auVar176._0_16_);
              auVar92 = auVar198._0_16_;
              (*pGVar10->intersectionFilterN)(&local_650);
              auVar92 = vpcmpeqd_avx(auVar92,auVar92);
              auVar198 = ZEXT1664(auVar92);
              auVar189 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar214 = vcmpps_avx(auVar214,auVar214,0xf);
              auVar176 = ZEXT3264(auVar214);
              pSVar90 = (Scene *)CONCAT44(fStack_5bc,local_5c0);
              auVar168 = ZEXT1664(local_620._0_16_);
            }
            auVar92 = auVar198._0_16_;
            if (local_670 == (undefined1  [16])0x0) {
              auVar111 = vpcmpeqd_avx(auVar189._0_16_,(undefined1  [16])0x0);
              auVar92 = auVar92 ^ auVar111;
              auVar204 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              pauVar89 = local_5e0;
            }
            else {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                auVar214 = ZEXT1632(auVar176._0_16_);
                (*p_Var12)(&local_650);
                auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                auVar198 = ZEXT1664(auVar92);
                auVar189 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar214 = vcmpps_avx(auVar214,auVar214,0xf);
                auVar176 = ZEXT3264(auVar214);
                pSVar90 = (Scene *)CONCAT44(fStack_5bc,local_5c0);
                auVar168 = ZEXT1664(local_620._0_16_);
              }
              auVar111 = vpcmpeqd_avx(auVar189._0_16_,local_670);
              auVar92 = auVar198._0_16_ ^ auVar111;
              auVar204 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              pauVar89 = local_5e0;
              if (local_670 != (undefined1  [16])0x0) {
                auVar111 = auVar198._0_16_ ^ auVar111;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])local_650.hit);
                *(undefined1 (*) [16])(local_650.ray + 0xc0) = auVar110;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x10));
                *(undefined1 (*) [16])(local_650.ray + 0xd0) = auVar110;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x20));
                *(undefined1 (*) [16])(local_650.ray + 0xe0) = auVar110;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x30));
                *(undefined1 (*) [16])(local_650.ray + 0xf0) = auVar110;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x40));
                *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar110;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x50));
                *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar110;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x60));
                *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar110;
                auVar110 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x70));
                *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar110;
                auVar111 = vmaskmovps_avx(auVar111,*(undefined1 (*) [16])(local_650.hit + 0x80));
                *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar111;
              }
            }
            if ((local_5a0 & auVar92) == (undefined1  [16])0x0) {
              *(int *)(ray + k * 4 + 0x80) = auVar168._0_4_;
            }
            else {
              auVar168 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_600 + uVar87 * 4) = 0;
            auVar92 = vshufps_avx(auVar168._0_16_,auVar168._0_16_,0);
            auVar100._16_16_ = auVar92;
            auVar100._0_16_ = auVar92;
            auVar214 = vcmpps_avx(_local_580,auVar100,2);
            local_600 = vandps_avx(auVar214,local_600);
          }
          if ((((((((local_600 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_600 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_600 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_600 >> 0x7f,0) == '\0') &&
                (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_600 >> 0xbf,0) == '\0') &&
              (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_600[0x1f]) {
            return;
          }
          auVar214 = vblendvps_avx(auVar204._0_32_,_local_580,local_600);
          auVar166 = vshufps_avx(auVar214,auVar214,0xb1);
          auVar166 = vminps_avx(auVar214,auVar166);
          auVar174 = vshufpd_avx(auVar166,auVar166,5);
          auVar166 = vminps_avx(auVar166,auVar174);
          auVar174 = vperm2f128_avx(auVar166,auVar166,1);
          auVar166 = vminps_avx(auVar166,auVar174);
          auVar166 = vcmpps_avx(auVar214,auVar166,0);
          auVar174 = local_600 & auVar166;
          auVar214 = local_600;
          if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar174 >> 0x7f,0) != '\0') ||
                (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar174 >> 0xbf,0) != '\0') ||
              (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar174[0x1f] < '\0') {
            auVar214 = vandps_avx(auVar166,local_600);
          }
          uVar85 = vmovmskps_avx(auVar214);
          uVar86 = 0;
          if (uVar85 != 0) {
            for (; (uVar85 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(normal.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Intersect1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }